

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sizeclasstable.h
# Opt level: O2

size_t snmalloc::index_in_object(sizeclass_t sc,address_t addr)

{
  ulong uVar1;
  
  uVar1 = (ulong)(((uint)sc.value & 0x7f) << 5);
  return (addr & *(ulong *)(sizeclass_metadata + uVar1 + 8)) -
         (*(long *)(sizeclass_metadata + uVar1 + 0x10) *
          (addr & *(ulong *)(sizeclass_metadata + uVar1 + 8)) >> 0x36) *
         *(long *)(sizeclass_metadata + uVar1);
}

Assistant:

constexpr size_t index_in_object(sizeclass_t sc, address_t addr)
  {
    return addr - start_of_object(sc, addr);
  }